

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O1

void validate_primal_solution
               (Instance *instance,Solution *solution,int32_t min_num_customers_served)

{
  Tour *tour;
  uint uVar1;
  int iVar2;
  uint i;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  double dVar6;
  double local_48;
  double local_40;
  double local_38;
  
  tour = &solution->tour;
  validate_tour(instance,tour,min_num_customers_served);
  dVar6 = (solution->primal_bound - solution->dual_bound) / (ABS(solution->primal_bound) + 1e-10);
  if ((dVar6 <= 0.0) && (1e-06 < ABS(dVar6))) {
    __assert_fail("fgte(gap, 0.0, 1e-6)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                  ,0x34,"void validate_primal_solution(const Instance *, Solution *, int32_t)");
  }
  dVar6 = INFINITY;
  if ((solution->tour).num_comps != 1) {
LAB_00106817:
    if (1e-05 < ABS(dVar6 - solution->primal_bound)) {
      __assert_fail("feq(obj, solution->primal_bound, 1e-5)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                    ,0x39,"void validate_primal_solution(const Instance *, Solution *, int32_t)");
    }
    return;
  }
  uVar1 = tour->num_customers;
  if (-1 < (int)uVar1) {
    uVar5 = 0;
    bVar4 = false;
    do {
      iVar2 = (solution->tour).succ[uVar5];
      if ((-1 < iVar2) && (((int)uVar1 < iVar2 || ((solution->tour).comp[uVar5] != 0)))) {
        if (!bVar4) goto LAB_00106817;
        break;
      }
      bVar4 = uVar1 <= uVar5;
      uVar5 = uVar5 + 1;
    } while ((ulong)uVar1 + 1 != uVar5);
  }
  if (-1 < (int)uVar1) {
    local_40 = *instance->demands + 0.0;
    local_38 = 0.0;
    local_48 = *instance->profits + 0.0;
    uVar5 = 0;
    do {
      i = (uint)uVar5;
      uVar1 = (solution->tour).succ[uVar5];
      lVar3 = (long)(int)uVar1;
      if (lVar3 == 0) {
        dVar6 = cptp_dist(instance,i,0);
        uVar5 = -(ulong)(instance->vehicle_cap < local_40);
        dVar6 = (double)(uVar5 & 0x7ff0000000000000 |
                        ~uVar5 & (ulong)((local_38 + dVar6) - local_48));
        goto LAB_00106817;
      }
      if (uVar1 == i) {
        __assert_fail("next_vertex != curr_vertex",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                      ,0x80,"double tour_eval(const Instance *, Tour *)");
      }
      dVar6 = cptp_dist(instance,i,uVar1);
      if ((int)uVar1 < 0) break;
      local_48 = local_48 + instance->profits[lVar3];
      local_40 = local_40 + instance->demands[lVar3];
      local_38 = local_38 + dVar6;
      uVar5 = (ulong)uVar1;
    } while ((int)uVar1 <= tour->num_customers);
  }
  __assert_fail("idx >= 0 && idx < len",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/types.h"
                ,0x6c,"int32_t *veci32_access(int32_t *, int32_t, int32_t)");
}

Assistant:

void validate_primal_solution(const Instance *instance, Solution *solution,
                              int32_t min_num_customers_served) {
#ifndef NDEBUG

    validate_tour(instance, &solution->tour, min_num_customers_served);

    // Upper bound should be bigger than lower bound
    double gap = solution_relgap(solution);
    assert(fgte(gap, 0.0, 1e-6));

    // The recomputed objective value should be the same of what is stored
    // inside the solution
    double obj = tour_eval(instance, &solution->tour);
    assert(feq(obj, solution->primal_bound, 1e-5));

#else
    UNUSED_PARAM(instance);
    UNUSED_PARAM(solution);
    UNUSED_PARAM(min_num_customers_served);
#endif
}